

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O3

void __thiscall r_exec::AntiPGMController::reduce(AntiPGMController *this,View *input)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *this_00;
  pointer pcVar1;
  int iVar2;
  _Object *p_Var3;
  _iterator _Var4;
  P<r_exec::Overlay> local_50;
  const_iterator local_48;
  int64_t *local_38;
  undefined4 extraout_var;
  
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this_00 = &(this->super__PGMController).super_OController.overlays;
  _Var4._cell = (this->super__PGMController).super_OController.overlays.used_cells_head;
  local_48._list = this_00;
  local_48.super__iterator._cell = _Var4._cell;
  if (_Var4._cell != -1) {
    local_38 = &(this->super__PGMController).super_OController.overlays.used_cells_head;
    do {
      iVar2 = (*(((local_48._list)->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[_Var4._cell].data.object)->_vptr__Object
                [4])();
      if ((char)iVar2 == '\0') {
        p_Var3 = ((local_48._list)->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_48.super__iterator._cell].data.
                 object;
        iVar2 = (*p_Var3->_vptr__Object[3])(p_Var3,input);
        p_Var3 = (_Object *)CONCAT44(extraout_var,iVar2);
        pcVar1 = ((local_48._list)->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->super__PGMController).field_0x99 == '\x01') {
          p_Var3 = pcVar1[local_48.super__iterator._cell].data.object;
          (*p_Var3->_vptr__Object[2])(p_Var3);
          *(undefined4 *)local_38 = 0xffffffff;
          *(undefined4 *)((long)local_38 + 4) = 0xffffffff;
          *(undefined4 *)(local_38 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_38 + 0xc) = 0xffffffff;
          local_38[2] = -1;
          (this->super__PGMController).super_OController.overlays.used_cell_count = 0;
          (this->super__PGMController).super_OController.overlays.free_cell_count = 0;
          std::
          vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
          ::clear(&this_00->cells);
          LOCK();
          (p_Var3->refCount).super___atomic_base<long>._M_i =
               (p_Var3->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
          local_50.object = p_Var3;
          r_code::list<core::P<r_exec::Overlay>_>::push_back(this_00,&local_50);
          if (local_50.object != (_Object *)0x0) {
            LOCK();
            ((local_50.object)->refCount).super___atomic_base<long>._M_i =
                 ((local_50.object)->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if (((local_50.object)->refCount).super___atomic_base<long>._M_i < 1) {
              (*(local_50.object)->_vptr__Object[1])();
            }
          }
          (this->super__PGMController).field_0x99 = 0;
          break;
        }
        local_48.super__iterator._cell = pcVar1[local_48.super__iterator._cell].next;
        _Var4._cell = local_48.super__iterator._cell;
        if (p_Var3 != (_Object *)0x0) {
          LOCK();
          (p_Var3->refCount).super___atomic_base<long>._M_i =
               (p_Var3->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
          local_50.object = p_Var3;
          r_code::list<core::P<r_exec::Overlay>_>::push_front(this_00,&local_50);
          if (local_50.object != (_Object *)0x0) {
            LOCK();
            ((local_50.object)->refCount).super___atomic_base<long>._M_i =
                 ((local_50.object)->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if (((local_50.object)->refCount).super___atomic_base<long>._M_i < 1) {
              (*(local_50.object)->_vptr__Object[1])();
            }
          }
          _Var4._cell = local_48.super__iterator._cell;
        }
      }
      else {
        local_48 = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&local_48);
        _Var4._cell = local_48.super__iterator._cell._cell;
      }
    } while (_Var4._cell != -1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void AntiPGMController::reduce(r_exec::View *input)
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_code::list<P<Overlay> >::const_iterator o;

    for (o = overlays.begin(); o != overlays.end();) {
        if ((*o)->is_invalidated()) {
            o = overlays.erase(o);
        } else {
            Overlay *offspring = (*o)->reduce_view(input);

            if (successful_match) { // the controller has been restarted: reset the overlay and kill all others
                Overlay *overlay = *o;
                overlay->reset();
                overlays.clear();
                overlays.push_back(overlay);
                successful_match = false;
                break;
            }

            ++o;

            if (offspring) {
                overlays.push_front(offspring);
            }
        }
    }
}